

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

void set_address(quicly_address_t *addr,sockaddr *sa)

{
  short sVar1;
  short *in_RSI;
  undefined8 *in_RDI;
  
  if (in_RSI == (short *)0x0) {
    *(undefined2 *)in_RDI = 0;
  }
  else {
    sVar1 = *in_RSI;
    if (sVar1 == 0) {
      *(undefined2 *)in_RDI = 0;
    }
    else if (sVar1 == 2) {
      *in_RDI = *(undefined8 *)in_RSI;
      in_RDI[1] = *(undefined8 *)(in_RSI + 4);
    }
    else {
      if (sVar1 != 10) {
        memset(in_RDI,0xff,0x1c);
        __assert_fail("!\"unexpected address type\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                      ,0x206,"void set_address(quicly_address_t *, struct sockaddr *)");
      }
      *in_RDI = *(undefined8 *)in_RSI;
      in_RDI[1] = *(undefined8 *)(in_RSI + 4);
      in_RDI[2] = *(undefined8 *)(in_RSI + 8);
      *(undefined4 *)(in_RDI + 3) = *(undefined4 *)(in_RSI + 0xc);
    }
  }
  return;
}

Assistant:

static void set_address(quicly_address_t *addr, struct sockaddr *sa)
{
    if (sa == NULL) {
        addr->sa.sa_family = AF_UNSPEC;
        return;
    }

    switch (sa->sa_family) {
    case AF_UNSPEC:
        addr->sa.sa_family = AF_UNSPEC;
        break;
    case AF_INET:
        addr->sin = *(struct sockaddr_in *)sa;
        break;
    case AF_INET6:
        addr->sin6 = *(struct sockaddr_in6 *)sa;
        break;
    default:
        memset(addr, 0xff, sizeof(*addr));
        assert(!"unexpected address type");
        break;
    }
}